

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callFunctionTestSuite.cpp
# Opt level: O2

bool callMultipleSimpleFoo(void)

{
  int iVar1;
  bool bVar2;
  allocator<char> local_61;
  string local_60;
  Test t;
  
  Test::Test(&t);
  iVar1 = 10;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    accessor::callFunction<accessor::FunctionWrapper<Test,void>,Test>(&t);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"foo",&local_61);
  iVar1 = Test::getMethodVisitedCounter(&t,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)&t);
  return iVar1 == 10;
}

Assistant:

bool callMultipleSimpleFoo()
{
  Test t;
  int callsNumber = 10;

  for (int i = 0; i < callsNumber; ++i )
  {
    ::accessor::callFunction<TestFoo>(t);
  }

  return (t.getMethodVisitedCounter("foo") == 10);
}